

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

int __thiscall Js::InterpreterStackFrame::OP_GetMemorySize(InterpreterStackFrame *this)

{
  uint uVar1;
  WebAssemblyMemory *this_00;
  
  this_00 = GetWebAssemblyMemory(this);
  uVar1 = WebAssemblyMemory::GetCurrentMemoryPages(this_00);
  return uVar1;
}

Assistant:

int InterpreterStackFrame::OP_GetMemorySize()
    {
#ifdef ENABLE_WASM
        return (int)GetWebAssemblyMemory()->GetCurrentMemoryPages();
#else
        Assert(UNREACHED);
        return 0;
#endif
    }